

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O0

void __thiscall
QColorTransformPrivate::apply<unsigned_char,unsigned_int>
          (QColorTransformPrivate *this,uchar *dst,uint *src,qsizetype count,TransformFlags flags)

{
  bool bVar1;
  QColorSpacePrivate *pQVar2;
  longlong *plVar3;
  long len_00;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  QColorTransformPrivate *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  qsizetype len;
  qsizetype i;
  QUninitialized<QColorVector,_256> buffer;
  QColorVector *in_stack_ffffffffffffef98;
  QColorVector *in_stack_ffffffffffffefa0;
  QColorTransformPrivate *this_00;
  QColorTransformPrivate *in_stack_ffffffffffffefb8;
  long lVar4;
  undefined4 in_stack_ffffffffffffefe0;
  QFlagsStorage<QColorTransformPrivate::TransformFlag> flags_00;
  QUninitialized local_1008 [4096];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
                     ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x4d4248);
  bVar1 = QColorSpacePrivate::isThreeComponentMatrix(pQVar2);
  if (bVar1) {
    updateLutsIn(in_stack_ffffffffffffefb8);
  }
  pQVar2 = QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
                     ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x4d426e);
  bVar1 = QColorSpacePrivate::isThreeComponentMatrix(pQVar2);
  if (bVar1) {
    updateLutsOut(in_stack_ffffffffffffefb8);
  }
  for (lVar4 = 0; lVar4 < in_RCX;
      lVar4 = (long)&(this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + lVar4)
  {
    flags_00.i = (Int)((ulong)(in_RCX - lVar4) >> 0x20);
    plVar3 = qMin<long_long>((longlong *)&stack0xffffffffffffefe8,&WorkBlockSize);
    this_00 = (QColorTransformPrivate *)*plVar3;
    len_00 = in_RDX + lVar4 * 4;
    QUninitialized::operator_cast_to_QColorVector_(local_1008);
    applyConvertIn<unsigned_int>
              (in_RDI,(uint *)in_stack_ffffffffffffefa0,
               (QColorVector *)CONCAT44(in_R8D,in_stack_ffffffffffffefe0),
               (qsizetype)in_stack_ffffffffffffef98,(TransformFlags)flags_00.i);
    QUninitialized::operator_cast_to_QColorVector_(local_1008);
    pcsAdapt(in_RDI,in_stack_ffffffffffffefa0,(qsizetype)in_stack_ffffffffffffef98);
    in_stack_ffffffffffffef98 = (QColorVector *)(in_RSI + lVar4);
    in_stack_ffffffffffffefa0 = (QColorVector *)(in_RDX + lVar4 * 4);
    QUninitialized::operator_cast_to_QColorVector_(local_1008);
    in_stack_ffffffffffffefe0 = in_R8D;
    applyConvertOut<unsigned_char,unsigned_int>
              (this_00,(uchar *)in_RDI,(uint *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98,
               len_00,(QFlagsStorageHelper<QColorTransformPrivate::TransformFlag,_4>)
                      SUB84((ulong)lVar4 >> 0x20,0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorTransformPrivate::apply(D *dst, const S *src, qsizetype count, TransformFlags flags) const
{
    if (colorSpaceIn->isThreeComponentMatrix())
        updateLutsIn();
    if (colorSpaceOut->isThreeComponentMatrix())
        updateLutsOut();

    Q_DECL_UNINITIALIZED QUninitialized<QColorVector, WorkBlockSize> buffer;
    qsizetype i = 0;
    while (i < count) {
        const qsizetype len = qMin(count - i, WorkBlockSize);

        applyConvertIn(src + i, buffer, len, flags);

        pcsAdapt(buffer, len);

        applyConvertOut(dst + i, src + i, buffer, len, flags);

        i += len;
    }
}